

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O3

void __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::refresh(summary_impl<unsigned_int,_6UL> *this)

{
  __int_type_conflict _Var1;
  __pointer_type pdVar2;
  __int_type_conflict _Var3;
  array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *__range4;
  array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL> *paVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  if (0 < (this->refresh_time_).__r) {
    _Var1 = (this->tp_).super___atomic_base<unsigned_long>._M_i;
    _Var3 = std::chrono::_V2::steady_clock::now();
    uVar5 = (_Var3 - _Var1) / 1000000;
    if ((ulong)(this->refresh_time_).__r <= uVar5) {
      LOCK();
      bVar10 = _Var1 == (this->tp_).super___atomic_base<unsigned_long>._M_i;
      if (bVar10) {
        (this->tp_).super___atomic_base<unsigned_long>._M_i = _Var3;
      }
      UNLOCK();
      if (bVar10) {
        if (uVar5 < (ulong)((this->refresh_time_).__r * 2)) {
          uVar5 = (long)(this->frontend_data_index_).super___atomic_base<int>._M_i ^ 1;
          pdVar2 = (this->data_)._M_elems[uVar5]._M_b._M_p;
          if (pdVar2 != (__pointer_type)0x0) {
            lVar6 = 0;
            do {
              if (*(long *)((long)&(pdVar2->arr)._M_elems[0]._M_b._M_p + lVar6) != 0) {
                lVar7 = *(long *)((long)&(pdVar2->arr)._M_elems[0]._M_b._M_p + lVar6);
                lVar8 = 0;
                do {
                  *(undefined4 *)(lVar7 + lVar8) = 0;
                  lVar8 = lVar8 + 4;
                } while (lVar8 != 0x200);
              }
              lVar6 = lVar6 + 8;
            } while (lVar6 != 0x400);
          }
          LOCK();
          (this->frontend_data_index_).super___atomic_base<int>._M_i = (__int_type_conflict2)uVar5;
          UNLOCK();
        }
        else {
          paVar4 = &this->data_;
          lVar6 = 0x18;
          do {
            if (paVar4->_M_elems[0]._M_b._M_p != (__pointer_type)0x0) {
              pdVar2 = paVar4->_M_elems[0]._M_b._M_p;
              lVar7 = 0;
              do {
                if (*(long *)((long)&(pdVar2->arr)._M_elems[0]._M_b._M_p + lVar7) != 0) {
                  lVar8 = *(long *)((long)&(pdVar2->arr)._M_elems[0]._M_b._M_p + lVar7);
                  lVar9 = 0;
                  do {
                    *(undefined4 *)(lVar8 + lVar9) = 0;
                    lVar9 = lVar9 + 4;
                  } while (lVar9 != 0x200);
                }
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x400);
            }
            paVar4 = (array<std::atomic<ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t_*>,_2UL>
                      *)((long)&(((atomic<unsigned_long> *)(&this->data_ + -1))->
                                super___atomic_base<unsigned_long>)._M_i + lVar6);
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x28);
        }
      }
    }
  }
  return;
}

Assistant:

void refresh() {
    if (refresh_time_.count() <= 0) {
      return;
    }
    uint64_t old_tp = tp_;
    auto new_tp = std::chrono::steady_clock::now().time_since_epoch().count();
    auto ms = (new_tp - old_tp) / ms_count;
    if (; ms >= refresh_time_.count()) [[unlikely]] {
      if (tp_.compare_exchange_strong(old_tp, new_tp)) {
        if (ms >= 2 * refresh_time_.count()) {
          for (auto& data : data_) {
            if (data != nullptr) {
              data.load()->refresh();
            }
          }
        }
        else {
          auto pos = frontend_data_index_ ^ 1;
          if (auto data = data_[pos].load(); data != nullptr) {
            data->refresh();
          }
          frontend_data_index_ = pos;
        }
      }
    }
  }